

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O2

void __thiscall
CVmObjStringBuffer::splice_text
          (CVmObjStringBuffer *this,vm_obj_id_t self,int32_t idx,int32_t del_chars,char *src,
          int32_t ins_bytes,int undo)

{
  int32_t idx_00;
  size_t sVar1;
  long lVar2;
  int32_t ins_chars;
  int32_t del_chars_local;
  int32_t idx_local;
  
  del_chars_local = del_chars;
  idx_local = idx;
  sVar1 = utf8_ptr::s_len(src,(long)ins_bytes);
  ins_chars = (int32_t)sVar1;
  adjust_args(this,&idx_local,&del_chars_local,&ins_chars);
  idx_00 = idx_local;
  lVar2 = (long)idx_local;
  if (undo != 0) {
    add_undo_rec(this,self,STRBUF_UNDO_REPL,idx_local,del_chars_local,ins_chars);
  }
  splice_move(this,idx_00,del_chars_local,ins_chars);
  utf8_ptr::to_wchar((wchar_t *)((this->super_CVmObject).ext_ + lVar2 * 4 + 0xc),(long)ins_chars,src
                     ,(long)ins_bytes);
  return;
}

Assistant:

void CVmObjStringBuffer::splice_text(VMG_ vm_obj_id_t self,
                                     int32_t idx, int32_t del_chars,
                                     const char *src, int32_t ins_bytes,
                                     int undo)
{
    /* figure the character length of the string */
    utf8_ptr p((char *)src);
    int32_t ins_chars = p.len(ins_bytes);

    /* check arguments */
    adjust_args(&idx, &del_chars, &ins_chars);

    /* if desired, save undo */
    if (undo)
        add_undo_rec(vmg_ self, STRBUF_UNDO_REPL, idx, del_chars, ins_chars);

    /* open up a gap in the buffer */
    splice_move(vmg_ idx, del_chars, ins_chars);

    /* decode characters into the buffer */
    p.to_wchar(get_ext()->buf + idx, ins_chars, src, ins_bytes);
}